

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Entity_State_PDU::Entity_State_PDU(Entity_State_PDU *this,Entity_State_PDU *ESPDU)

{
  undefined8 uVar1;
  DeadReckoningCalculator *pDVar2;
  KFLOAT64 KVar3;
  KUINT16 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  KUINT8 KVar8;
  KUINT8 KVar9;
  KFLOAT32 KVar10;
  KOCTET KVar11;
  KOCTET KVar12;
  KOCTET KVar13;
  KOCTET KVar14;
  KOCTET KVar15;
  KOCTET KVar16;
  KOCTET KVar17;
  KCHAR8 KVar18;
  KCHAR8 KVar19;
  KCHAR8 KVar20;
  KCHAR8 KVar21;
  KCHAR8 KVar22;
  KCHAR8 KVar23;
  KCHAR8 KVar24;
  DeadReckoningCalculator *this_00;
  
  Header7::Header7(&this->super_Header,&ESPDU->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_00218060;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00214e38;
  KVar4 = (ESPDU->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (ESPDU->m_EntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar4;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00214cd8;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ESPDU->m_EntityID).super_SimulationIdentifier.field_0xc;
  this->m_ui8ForceID = ESPDU->m_ui8ForceID;
  this->m_ui8NumOfVariableParams = ESPDU->m_ui8NumOfVariableParams;
  (this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214d88;
  KVar5 = (ESPDU->m_EntityType).m_ui8Domain;
  KVar4 = (ESPDU->m_EntityType).m_ui16Country;
  KVar6 = (ESPDU->m_EntityType).m_ui8Category;
  KVar7 = (ESPDU->m_EntityType).m_ui8SubCategory;
  KVar8 = (ESPDU->m_EntityType).m_ui8Specific;
  KVar9 = (ESPDU->m_EntityType).m_ui8Extra;
  (this->m_EntityType).m_ui8EntityKind = (ESPDU->m_EntityType).m_ui8EntityKind;
  (this->m_EntityType).m_ui8Domain = KVar5;
  (this->m_EntityType).m_ui16Country = KVar4;
  (this->m_EntityType).m_ui8Category = KVar6;
  (this->m_EntityType).m_ui8SubCategory = KVar7;
  (this->m_EntityType).m_ui8Specific = KVar8;
  (this->m_EntityType).m_ui8Extra = KVar9;
  (this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214d88;
  KVar5 = (ESPDU->m_AltEntityType).m_ui8Domain;
  KVar4 = (ESPDU->m_AltEntityType).m_ui16Country;
  KVar6 = (ESPDU->m_AltEntityType).m_ui8Category;
  KVar7 = (ESPDU->m_AltEntityType).m_ui8SubCategory;
  KVar8 = (ESPDU->m_AltEntityType).m_ui8Specific;
  KVar9 = (ESPDU->m_AltEntityType).m_ui8Extra;
  (this->m_AltEntityType).m_ui8EntityKind = (ESPDU->m_AltEntityType).m_ui8EntityKind;
  (this->m_AltEntityType).m_ui8Domain = KVar5;
  (this->m_AltEntityType).m_ui16Country = KVar4;
  (this->m_AltEntityType).m_ui8Category = KVar6;
  (this->m_AltEntityType).m_ui8SubCategory = KVar7;
  (this->m_AltEntityType).m_ui8Specific = KVar8;
  (this->m_AltEntityType).m_ui8Extra = KVar9;
  (this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214ee8;
  KVar10 = (ESPDU->m_EntityLinearVelocity).m_f32Y;
  (this->m_EntityLinearVelocity).m_f32X = (ESPDU->m_EntityLinearVelocity).m_f32X;
  (this->m_EntityLinearVelocity).m_f32Y = KVar10;
  (this->m_EntityLinearVelocity).m_f32Z = (ESPDU->m_EntityLinearVelocity).m_f32Z;
  (this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214f40;
  KVar3 = (ESPDU->m_EntityLocation).m_f64Y;
  (this->m_EntityLocation).m_f64X = (ESPDU->m_EntityLocation).m_f64X;
  (this->m_EntityLocation).m_f64Y = KVar3;
  (this->m_EntityLocation).m_f64Z = (ESPDU->m_EntityLocation).m_f64Z;
  (this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EulerAngles_00214de0;
  KVar10 = (ESPDU->m_EntityOrientation).m_f32Theta;
  (this->m_EntityOrientation).m_f32Psi = (ESPDU->m_EntityOrientation).m_f32Psi;
  (this->m_EntityOrientation).m_f32Theta = KVar10;
  (this->m_EntityOrientation).m_f32Phi = (ESPDU->m_EntityOrientation).m_f32Phi;
  (this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_00214c28;
  (this->m_EntityAppearance).m_Appearance = (ESPDU->m_EntityAppearance).m_Appearance;
  (this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DeadReckoningParameter_00214bd0;
  KVar11 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[0];
  KVar12 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[1];
  KVar13 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[2];
  KVar14 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[3];
  KVar15 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[4];
  KVar16 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[5];
  KVar17 = (ESPDU->m_DeadReckoningParameter).m_OtherParams[6];
  uVar1 = *(undefined8 *)((ESPDU->m_DeadReckoningParameter).m_OtherParams + 7);
  (this->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm =
       (ESPDU->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm;
  (this->m_DeadReckoningParameter).m_OtherParams[0] = KVar11;
  (this->m_DeadReckoningParameter).m_OtherParams[1] = KVar12;
  (this->m_DeadReckoningParameter).m_OtherParams[2] = KVar13;
  (this->m_DeadReckoningParameter).m_OtherParams[3] = KVar14;
  (this->m_DeadReckoningParameter).m_OtherParams[4] = KVar15;
  (this->m_DeadReckoningParameter).m_OtherParams[5] = KVar16;
  (this->m_DeadReckoningParameter).m_OtherParams[6] = KVar17;
  *(undefined8 *)((this->m_DeadReckoningParameter).m_OtherParams + 7) = uVar1;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214ee8;
  KVar10 = (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X =
       (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y = KVar10;
  (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z =
       (ESPDU->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z;
  (this->m_DeadReckoningParameter).m_AngularVelocity.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00214ee8;
  KVar10 = (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32X =
       (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32X;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y = KVar10;
  (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z =
       (ESPDU->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z;
  (this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityMarking_00214d30;
  KVar18 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[0];
  KVar19 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[1];
  KVar20 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[2];
  KVar21 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[3];
  KVar22 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[4];
  KVar23 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[5];
  KVar24 = (ESPDU->m_EntityMarking).m_sEntityMarkingString[6];
  uVar1 = *(undefined8 *)((ESPDU->m_EntityMarking).m_sEntityMarkingString + 4);
  (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet =
       (ESPDU->m_EntityMarking).m_ui8EntityMarkingCharacterSet;
  (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar18;
  (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar19;
  (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar20;
  (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar21;
  (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar22;
  (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar23;
  (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar24;
  *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) = uVar1;
  (this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityCapabilities_00214c80;
  (this->m_EntityCapabilities).field_0 = (ESPDU->m_EntityCapabilities).field_0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters,&ESPDU->m_vVariableParameters);
  pDVar2 = ESPDU->m_pDrCalc;
  if (pDVar2 == (DeadReckoningCalculator *)0x0) {
    this_00 = (DeadReckoningCalculator *)0x0;
  }
  else {
    this_00 = (DeadReckoningCalculator *)operator_new(0x170);
    UTILS::DeadReckoningCalculator::DeadReckoningCalculator(this_00,pDVar2);
  }
  this->m_pDrCalc = this_00;
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU( const Entity_State_PDU & ESPDU ) :
    Header( ESPDU ),
    m_EntityID( ESPDU.m_EntityID ),
    m_ui8ForceID( ESPDU.m_ui8ForceID ),
    m_ui8NumOfVariableParams( ESPDU.m_ui8NumOfVariableParams ),
    m_EntityType( ESPDU.m_EntityType ),
    m_AltEntityType( ESPDU.m_AltEntityType ),
    m_EntityLinearVelocity( ESPDU.m_EntityLinearVelocity ),
    m_EntityLocation( ESPDU.m_EntityLocation ),
    m_EntityOrientation( ESPDU.m_EntityOrientation ),
    m_EntityAppearance( ESPDU.m_EntityAppearance ),
    m_DeadReckoningParameter( ESPDU.m_DeadReckoningParameter ),
    m_EntityMarking( ESPDU.m_EntityMarking ),
    m_EntityCapabilities( ESPDU.m_EntityCapabilities ),
    m_vVariableParameters( ESPDU.m_vVariableParameters ),
    m_pDrCalc( ESPDU.m_pDrCalc ? new DeadReckoningCalculator( *ESPDU.m_pDrCalc ) : NULL )
{
}